

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

GCObject * luaC_newobj(lua_State *L,int tt,size_t sz)

{
  global_State *pgVar1;
  GCObject *pGVar2;
  
  pgVar1 = L->l_G;
  pGVar2 = (GCObject *)luaM_realloc_(L,(void *)0x0,(ulong)(tt & 0xf),sz);
  pGVar2->marked = pgVar1->currentwhite & 0x18;
  if (tt < 0x80) {
    pGVar2->tt = (lu_byte)tt;
    pGVar2->next = pgVar1->allgc;
    pgVar1->allgc = pGVar2;
    return pGVar2;
  }
  __assert_fail("tt <= 127",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                ,0x15d,"GCObject *luaC_newobj(lua_State *, int, size_t)");
}

Assistant:

GCObject *luaC_newobj (lua_State *L, int tt, size_t sz) {
  global_State *g = G(L);
  GCObject *o = cast(GCObject *, luaM_newobject(L, novariant(tt), sz));
  o->marked = luaC_white(g);
  lua_assert(tt <= 127); /* RAVI: Must fit in a byte */
  o->tt = tt;
  o->next = g->allgc;
  g->allgc = o;
  return o;
}